

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O3

void joystick_callback(int joy,int event)

{
  int iVar1;
  ulong in_RAX;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  int button_count;
  int axis_count;
  undefined8 local_28;
  
  iVar1 = joystick_count;
  if (event == 0x40001) {
    local_28 = in_RAX;
    glfwGetJoystickAxes(joy,(int *)((long)&local_28 + 4));
    glfwGetJoystickButtons(joy,(int *)&local_28);
    pcVar2 = glfwGetJoystickName(joy);
    printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",(ulong)(joy + 1),pcVar2,
           local_28 >> 0x20,local_28 & 0xffffffff);
    lVar3 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar3] = joy;
  }
  else if (event == 0x40002) {
    uVar4 = 0;
    if (0 < joystick_count) {
      piVar6 = joysticks;
      do {
        if (*piVar6 == joy) goto LAB_00110f9e;
        uVar4 = uVar4 + 1;
        piVar6 = piVar6 + 1;
      } while ((uint)joystick_count != uVar4);
      uVar4 = (ulong)(uint)joystick_count;
    }
LAB_00110f9e:
    iVar5 = (int)uVar4 + 1;
    if (iVar5 < joystick_count) {
      uVar4 = uVar4 & 0xffffffff;
      do {
        joysticks[uVar4 & 0xffffffff] = joysticks[uVar4 + 1];
        uVar4 = uVar4 + 1;
        iVar5 = iVar5 + 1;
      } while (iVar5 < iVar1);
    }
    printf("Lost joystick %i\n",(ulong)(joy + 1));
    joystick_count = joystick_count + -1;
  }
  return;
}

Assistant:

static void joystick_callback(int joy, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axis_count, button_count;

        glfwGetJoystickAxes(joy, &axis_count);
        glfwGetJoystickButtons(joy, &button_count);

        printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",
                joy + 1,
                glfwGetJoystickName(joy),
                axis_count,
                button_count);

        joysticks[joystick_count++] = joy;
    }
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == joy)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        printf("Lost joystick %i\n", joy + 1);
        joystick_count--;
    }
}